

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-grammar-parser.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  undefined4 *puVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ppVar3;
  byte bVar4;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  initializer_list<llama_grammar_element> __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_01;
  initializer_list<llama_grammar_element> __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_03;
  initializer_list<llama_grammar_element> __l_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_05;
  initializer_list<llama_grammar_element> __l_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_07;
  initializer_list<llama_grammar_element> __l_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_09;
  initializer_list<llama_grammar_element> __l_10;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_11;
  initializer_list<llama_grammar_element> __l_12;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_13;
  initializer_list<llama_grammar_element> __l_14;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_15;
  initializer_list<llama_grammar_element> __l_16;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_17;
  initializer_list<llama_grammar_element> __l_18;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_19;
  initializer_list<llama_grammar_element> __l_20;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_21;
  initializer_list<llama_grammar_element> __l_22;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_23;
  initializer_list<llama_grammar_element> __l_24;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_25;
  initializer_list<llama_grammar_element> __l_26;
  int local_5e8;
  int local_5e4 [2];
  int local_5dc;
  _Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_> local_5d8;
  int local_5b8;
  allocator_type local_5b2;
  allocator_type local_5b1;
  int local_5b0;
  int local_5ac [7];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_590;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_578;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_560;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_548;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_530;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_518;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_500;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_4e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_4d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_4b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_4a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_488;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_470;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_440;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_378;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_350;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_328 [6];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_228;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  pStack_200;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_160;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_48;
  
  bVar4 = 0;
  verify_failure("\n        root ::= \"a\"{,}\"\n    ");
  verify_failure("\n        root ::= \"a\"{,10}\"\n    ");
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  __l._M_len = 1;
  __l._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_458,__l,(allocator_type *)local_5e4);
  local_5d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x6100000003;
  local_5d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_5d8;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_228,
             __l_00,(allocator_type *)&local_5e8);
  verify_parsing("\n        root  ::= \"a\"\n    ",&local_458,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_228
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            ((_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             &local_228);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_458);
  std::__cxx11::string::~string((string *)&local_440);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_228,(char (*) [5])"root",local_5e4 + 1);
  __l_01._M_len = 1;
  __l_01._M_array = &local_228;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_470,__l_01,(allocator_type *)local_5e4);
  puVar2 = &DAT_001068b4;
  ppVar3 = &local_440;
  for (lVar1 = 0x14; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined4 *)&(ppVar3->first)._M_dataplus._M_p = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)ppVar3 + (ulong)bVar4 * -8 + 4);
  }
  __l_02._M_len = 10;
  __l_02._M_array = (iterator)&local_440;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_02,(allocator_type *)&local_5e8);
  verify_parsing("\n        root  ::= \"a\" | [bdx-z] | [^1-3]\n    ",&local_470,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_470);
  std::__cxx11::string::~string((string *)&local_228);
  local_5e4[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_int,_true>(&local_440,(char (*) [2])"a",local_5e4 + 1);
  local_5e4[0] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_418,(char (*) [5])"root",local_5e4);
  local_5e8 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_3f0,(char (*) [7])"root_2",&local_5e8);
  __l_03._M_len = 3;
  __l_03._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_488,__l_03,(allocator_type *)&local_5dc);
  puVar2 = &DAT_00106904;
  ppVar3 = &local_228;
  for (lVar1 = 0x12; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined4 *)&(ppVar3->first)._M_dataplus._M_p = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)ppVar3 + (ulong)bVar4 * -8 + 4);
  }
  __l_04._M_len = 9;
  __l_04._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_04,(allocator_type *)&local_5b8);
  verify_parsing("\n        root  ::= a+\n        a     ::= \"a\"\n    ",&local_488,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_488);
  lVar1 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  local_5e4[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_418,(char (*) [7])"root_1",local_5e4);
  __l_05._M_len = 2;
  __l_05._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_4a0,__l_05,(allocator_type *)&local_5e8);
  local_228.second = 2;
  local_228._36_4_ = 1;
  pStack_200.first._M_dataplus._M_p = (pointer)0x1;
  local_228.first.field_2._M_allocated_capacity = 0;
  local_228.first.field_2._8_8_ = 0x6100000003;
  local_228.first._M_dataplus._M_p = (pointer)0x6100000003;
  local_228.first._M_string_length = 0x100000002;
  pStack_200.first._M_string_length = 0;
  __l_06._M_len = 7;
  __l_06._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_06,(allocator_type *)&local_5dc);
  verify_parsing("\n        root  ::= \"a\"+\n    ",&local_4a0,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_4a0);
  lVar1 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_int,_true>(&local_440,(char (*) [2])"a",local_5e4 + 1);
  local_5e4[0] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_418,(char (*) [5])"root",local_5e4);
  local_5e8 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_3f0,(char (*) [7])"root_2",&local_5e8);
  __l_07._M_len = 3;
  __l_07._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_4b8,__l_07,(allocator_type *)&local_5dc);
  local_228.second = 2;
  local_228._36_4_ = 1;
  pStack_200.first._M_dataplus._M_p = (pointer)0x1;
  local_228.first.field_2._M_allocated_capacity = 0x6100000003;
  local_228.first.field_2._8_8_ = 0;
  local_228.first._M_dataplus._M_p = (pointer)0x200000002;
  local_228.first._M_string_length = 0;
  pStack_200.first._M_string_length = 0;
  __l_08._M_len = 7;
  __l_08._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_08,(allocator_type *)&local_5b8);
  verify_parsing("\n        root  ::= a?\n        a     ::= \"a\"\n    ",&local_4b8,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_4b8);
  lVar1 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  local_5e4[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_418,(char (*) [7])"root_1",local_5e4);
  __l_09._M_len = 2;
  __l_09._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_4d0,__l_09,(allocator_type *)&local_5e8);
  local_228.first.field_2._M_allocated_capacity = 0x6100000003;
  local_228.first.field_2._8_8_ = 1;
  local_228.first._M_dataplus._M_p = (pointer)0x100000002;
  local_228.first._M_string_length = 0;
  local_228.second = 0;
  local_228._36_4_ = 0;
  __l_10._M_len = 5;
  __l_10._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_10,(allocator_type *)&local_5dc);
  verify_parsing("\n        root  ::= \"a\"?\n    ",&local_4d0,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_4d0);
  lVar1 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_int,_true>(&local_440,(char (*) [2])"a",local_5e4 + 1);
  local_5e4[0] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_418,(char (*) [5])"root",local_5e4);
  local_5e8 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_3f0,(char (*) [7])"root_2",&local_5e8);
  __l_11._M_len = 3;
  __l_11._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_4e8,__l_11,(allocator_type *)&local_5dc);
  pStack_200.first._M_string_length = 1;
  pStack_200.first.field_2._M_allocated_capacity = 0;
  local_228.second = 2;
  local_228._36_4_ = 1;
  pStack_200.first._M_dataplus._M_p = (pointer)0x200000002;
  local_228.first.field_2._M_allocated_capacity = 0x6100000003;
  local_228.first.field_2._8_8_ = 0;
  local_228.first._M_dataplus._M_p = (pointer)0x200000002;
  local_228.first._M_string_length = 0;
  __l_12._M_len = 8;
  __l_12._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_12,(allocator_type *)&local_5b8);
  verify_parsing("\n        root  ::= a*\n        a     ::= \"a\"\n    ",&local_4e8,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_4e8);
  lVar1 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  local_5e4[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_418,(char (*) [7])"root_1",local_5e4);
  __l_13._M_len = 2;
  __l_13._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_500,__l_13,(allocator_type *)&local_5e8);
  local_228.second = 1;
  local_228._36_4_ = 0;
  pStack_200.first._M_dataplus._M_p = (pointer)0x0;
  local_228.first.field_2._M_allocated_capacity = 0x6100000003;
  local_228.first.field_2._8_8_ = 0x100000002;
  local_228.first._M_dataplus._M_p = (pointer)0x100000002;
  local_228.first._M_string_length = 0;
  __l_14._M_len = 6;
  __l_14._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_14,(allocator_type *)&local_5dc);
  verify_parsing("\n        root  ::= \"a\"*\n    ",&local_500,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_500);
  lVar1 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  __l_15._M_len = 1;
  __l_15._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_518,__l_15,(allocator_type *)local_5e4);
  local_5d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x6100000003;
  local_5d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6100000003;
  local_5d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)&local_5d8;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_228,
             __l_16,(allocator_type *)&local_5e8);
  verify_parsing("\n        root  ::= \"a\"{2}\n    ",&local_518,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_228
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            ((_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             &local_228);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_518);
  std::__cxx11::string::~string((string *)&local_440);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  local_5e4[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_418,(char (*) [7])"root_1",local_5e4);
  __l_17._M_len = 2;
  __l_17._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_530,__l_17,(allocator_type *)&local_5e8);
  pStack_200.first._M_string_length = 1;
  pStack_200.first.field_2._M_allocated_capacity = 0;
  local_228.second = 3;
  local_228._36_4_ = 0x61;
  pStack_200.first._M_dataplus._M_p = (pointer)0x100000002;
  local_228.first.field_2._M_allocated_capacity = 0x100000002;
  local_228.first.field_2._8_8_ = 0;
  local_228.first._M_dataplus._M_p = (pointer)0x6100000003;
  local_228.first._M_string_length = 0x6100000003;
  __l_18._M_len = 8;
  __l_18._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_18,(allocator_type *)&local_5dc);
  verify_parsing("\n        root  ::= \"a\"{2,}\n    ",&local_530,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_530);
  lVar1 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  __l_19._M_len = 1;
  __l_19._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_548,__l_19,(allocator_type *)local_5e4);
  local_228.first.field_2._M_allocated_capacity = 0x6100000003;
  local_228.first.field_2._8_8_ = 0x6100000003;
  local_228.first._M_dataplus._M_p = (pointer)0x6100000003;
  local_228.first._M_string_length = 0x6100000003;
  local_228.second = 0;
  local_228._36_4_ = 0;
  __l_20._M_len = 5;
  __l_20._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_20,(allocator_type *)&local_5e8);
  verify_parsing("\n        root  ::= \"a\"{ 4}\n    ",&local_548,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_548);
  std::__cxx11::string::~string((string *)&local_440);
  local_5e4[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"root",local_5e4 + 1);
  local_5e4[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_418,(char (*) [7])"root_1",local_5e4);
  local_5e8 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_3f0,(char (*) [7])"root_2",&local_5e8);
  __l_21._M_len = 3;
  __l_21._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_560,__l_21,(allocator_type *)&local_5dc);
  puVar2 = &DAT_00106ad4;
  ppVar3 = &local_228;
  for (lVar1 = 0x16; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined4 *)&(ppVar3->first)._M_dataplus._M_p = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)ppVar3 + (ulong)bVar4 * -8 + 4);
  }
  __l_22._M_len = 0xb;
  __l_22._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_22,(allocator_type *)&local_5b8);
  verify_parsing("\n        root  ::= \"a\"{2,4}\n    ",&local_560,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_560);
  lVar1 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_440,(char (*) [5])"expr",local_5e4 + 1);
  local_5e4[0] = 5;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_418,(char (*) [7])"expr_5",local_5e4);
  local_5e8 = 6;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_3f0,(char (*) [7])"expr_6",&local_5e8);
  local_5dc = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_3c8,(char (*) [5])"root",&local_5dc);
  local_5b8 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_3a0,(char (*) [7])"root_1",&local_5b8);
  local_5ac[3] = 4;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_378,(char (*) [7])"root_4",local_5ac + 3);
  local_5ac[2] = 3;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_350,(char (*) [5])"term",local_5ac + 2);
  local_5ac[1] = 7;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(local_328,(char (*) [7])"term_7",local_5ac + 1);
  __l_23._M_len = 8;
  __l_23._M_array = &local_440;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_578,__l_23,(allocator_type *)local_5ac);
  memcpy(&local_228,&DAT_00106b2c,0x110);
  __l_24._M_len = 0x22;
  __l_24._M_array = (iterator)&local_228;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_24,(allocator_type *)&local_5b0);
  verify_parsing("\n        root  ::= (expr \"=\" term \"\\n\")+\n        expr  ::= term ([-+*/] term)*\n        term  ::= [0-9]+\n    "
                 ,&local_578,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_578);
  lVar1 = 0x118;
  do {
    std::__cxx11::string::~string((string *)((long)&local_440.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  local_5e4[1] = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_228,(char (*) [5])"expr",local_5e4 + 1);
  local_5e4[0] = 6;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&pStack_200,(char (*) [7])"expr_6",local_5e4);
  local_5e8 = 7;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_1d8,(char (*) [7])"expr_7",&local_5e8);
  local_5dc = 8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[6],_int,_true>(&local_1b0,(char (*) [6])"ident",&local_5dc);
  local_5b8 = 10;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[9],_int,_true>(&local_188,(char (*) [9])"ident_10",&local_5b8);
  local_5ac[3] = 9;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[4],_int,_true>(&local_160,(char (*) [4])"num",local_5ac + 3);
  local_5ac[2] = 0xb;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_138,(char (*) [7])"num_11",local_5ac + 2);
  local_5ac[1] = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_110,(char (*) [5])"root",local_5ac + 1);
  local_5ac[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_e8,(char (*) [7])"root_1",local_5ac);
  local_5b0 = 5;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>(&local_c0,(char (*) [7])"root_5",&local_5b0);
  local_5ac[6] = 4;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>(&local_98,(char (*) [5])"term",local_5ac + 6);
  local_5ac[5] = 3;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[3],_int,_true>(&local_70,(char (*) [3])"ws",local_5ac + 5);
  local_5ac[4] = 0xc;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[6],_int,_true>(&local_48,(char (*) [6])"ws_12",local_5ac + 4);
  __l_25._M_len = 0xd;
  __l_25._M_array = &local_228;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_590,__l_25,&local_5b1);
  memcpy(&local_440,&DAT_00106c3c,0x218);
  __l_26._M_len = 0x43;
  __l_26._M_array = (iterator)&local_440;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8,
             __l_26,&local_5b2);
  verify_parsing("\n        root  ::= (expr \"=\" ws term \"\\n\")+\n        expr  ::= term ([-+*/] term)*\n        term  ::= ident | num | \"(\" ws expr \")\" ws\n        ident ::= [a-z] [a-z0-9_]* ws\n        num   ::= [0-9]+ ws\n        ws    ::= [ \\t\\n]*\n    "
                 ,&local_590,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_5d8
                );
  std::_Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~_Vector_base
            (&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_590);
  lVar1 = 0x1e0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_228.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return 0;
}

Assistant:

int main()
{
    verify_failure(R"""(
        root ::= "a"{,}"
    )""");

    verify_failure(R"""(
        root ::= "a"{,10}"
    )""");

    verify_parsing(R"""(
        root  ::= "a"
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a" | [bdx-z] | [^1-3]
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR, 'b'},
        {LLAMA_GRETYPE_CHAR_ALT, 'd'},
        {LLAMA_GRETYPE_CHAR_ALT, 'x'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR_NOT, '1'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '3'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a+
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"+
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a?
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"?
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a*
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"*
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2}
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2,}
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{ 4}
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2,4}
    )""", {
        {"root", 0},
        {"root_1", 1},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= (expr "=" term "\n")+
        expr  ::= term ([-+*/] term)*
        term  ::= [0-9]+
    )""", {
        {"expr", 2},
        {"expr_5", 5},
        {"expr_6", 6},
        {"root", 0},
        {"root_1", 1},
        {"root_4", 4},
        {"term", 3},
        {"term_7", 7},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_4 */ 4},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, '='},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_CHAR, '\n'},
        {LLAMA_GRETYPE_END, 0},
        // expr (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_END, 0},
        // term (index 3)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* term_7 */ 7},
        {LLAMA_GRETYPE_END, 0},
        // root_4 (index 4)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_4 */ 4},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // expr_5 (index 5)
        {LLAMA_GRETYPE_CHAR, '-'},
        {LLAMA_GRETYPE_CHAR_ALT, '+'},
        {LLAMA_GRETYPE_CHAR_ALT, '*'},
        {LLAMA_GRETYPE_CHAR_ALT, '/'},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_END, 0},
        // expr_6 (index 6)
        {LLAMA_GRETYPE_RULE_REF, /* expr_5 */ 5},
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // term_7 (index 7)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* term_7 */ 7},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= (expr "=" ws term "\n")+
        expr  ::= term ([-+*/] term)*
        term  ::= ident | num | "(" ws expr ")" ws
        ident ::= [a-z] [a-z0-9_]* ws
        num   ::= [0-9]+ ws
        ws    ::= [ \t\n]*
    )""", {
        {"expr", 2},
        {"expr_6", 6},
        {"expr_7", 7},
        {"ident", 8},
        {"ident_10", 10},
        {"num", 9},
        {"num_11", 11},
        {"root", 0},
        {"root_1", 1},
        {"root_5", 5},
        {"term", 4},
        {"ws", 3},
        {"ws_12", 12},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_5 */ 5},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, '='},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_CHAR, '\n'},
        {LLAMA_GRETYPE_END, 0},
        // expr (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_RULE_REF, /* expr_7 */ 7},
        {LLAMA_GRETYPE_END, 0},
        // ws (index 3)
        {LLAMA_GRETYPE_RULE_REF, /* ws_12 */ 12},
        {LLAMA_GRETYPE_END, 0},
        // term (index 4)
        {LLAMA_GRETYPE_RULE_REF, /* ident */ 8},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_RULE_REF, /* num */ 9},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR, '('},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, ')'},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // root_5 (index 5)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_5 */ 5},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // expr_6 (index 6)
        {LLAMA_GRETYPE_CHAR, '-'},
        {LLAMA_GRETYPE_CHAR_ALT, '+'},
        {LLAMA_GRETYPE_CHAR_ALT, '*'},
        {LLAMA_GRETYPE_CHAR_ALT, '/'},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_END, 0},
        // expr_7 (index 7)
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_RULE_REF, /* expr_7 */ 7},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // ident (index 8)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_RULE_REF, /* ident_10 */ 10},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // num (index 9)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* num_11 */ 11},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // ident_10 (index 10)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_CHAR_ALT, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_CHAR_ALT, '_'},
        {LLAMA_GRETYPE_RULE_REF, /* ident_10 */ 10},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // num_11 (index 11)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* num_11 */ 11},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // ws_12 (index 12)
        {LLAMA_GRETYPE_CHAR, ' '},
        {LLAMA_GRETYPE_CHAR_ALT, '\t'},
        {LLAMA_GRETYPE_CHAR_ALT, '\n'},
        {LLAMA_GRETYPE_RULE_REF, /* ws_12 */ 12},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    return 0;
}